

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.cc
# Opt level: O0

void __thiscall bsplib::Rdma::push_reg(Rdma *this,void *addr,size_t size)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  unsigned_long *puVar4;
  reference pvVar5;
  Memblock *pMVar6;
  mapped_type *this_00;
  undefined1 local_70 [8];
  PushEntry entry;
  Memblock block;
  unsigned_long local_30;
  Memslot local_28;
  Memslot id;
  size_t size_local;
  void *addr_local;
  Rdma *this_local;
  
  id = size;
  size_local = (size_t)addr;
  addr_local = this;
  local_28 = no_slot();
  bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty(&this->m_free_slots);
  if (bVar1) {
    sVar2 = std::vector<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>::size
                      (&this->m_used_slots);
    local_28 = sVar2 / (ulong)(long)this->m_nprocs;
    sVar2 = std::vector<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>::capacity
                      (&this->m_used_slots);
    sVar3 = std::vector<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>::size
                      (&this->m_used_slots);
    if (sVar2 < sVar3 + (long)this->m_nprocs) {
      sVar2 = std::vector<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>::capacity
                        (&this->m_used_slots);
      local_30 = sVar2 << 1;
      sVar2 = std::vector<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>::size
                        (&this->m_used_slots);
      block._16_8_ = sVar2 + (long)this->m_nprocs;
      puVar4 = std::max<unsigned_long>(&local_30,(unsigned_long *)&block.status);
      std::vector<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>::reserve
                (&this->m_used_slots,*puVar4);
    }
    sVar2 = std::vector<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>::size
                      (&this->m_used_slots);
    std::vector<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>::resize
              (&this->m_used_slots,sVar2 + (long)this->m_nprocs);
  }
  else {
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(&this->m_free_slots);
    local_28 = *pvVar5;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back(&this->m_free_slots);
  }
  entry.slot = size_local;
  block.addr = (void *)id;
  block.size._0_4_ = 1;
  pMVar6 = slot(this,this->m_pid,local_28);
  pMVar6->addr = (void *)entry.slot;
  pMVar6->size = (size_t)block.addr;
  *(ulong *)&pMVar6->status = CONCAT44(block.size._4_4_,(undefined4)block.size);
  this_00 = std::
            unordered_map<void_*,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
            ::operator[](&this->m_register,(key_type *)&size_local);
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::push_back(this_00,&local_28);
  local_70 = (undefined1  [8])entry.slot;
  entry.block.addr = block.addr;
  entry.block.size = CONCAT44(block.size._4_4_,(undefined4)block.size);
  entry.block._16_8_ = local_28;
  std::
  vector<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
  ::push_back(&(this->m_send_push_pop_comm_buf).m_pushed_slots,(value_type *)local_70);
  return;
}

Assistant:

void Rdma::push_reg( void * addr, size_t size )
{
    Memslot id = no_slot();
    if ( m_free_slots.empty() ) {
        id = m_used_slots.size() / m_nprocs;

        if ( m_used_slots.capacity() < m_used_slots.size() + m_nprocs )
            m_used_slots.reserve( std::max(
                        2*m_used_slots.capacity(),
                        m_used_slots.size() + m_nprocs ) );

        m_used_slots.resize( m_used_slots.size() + m_nprocs );
    }
    else {
        id = m_free_slots.back();
        m_free_slots.pop_back();
    }

    Memblock block = { addr, size, Memblock::PUSHED };
    slot( m_pid, id ) = block;
    m_register[ addr ].push_back( id );

    PushPopCommBuf::PushEntry entry = { block, id };
    m_send_push_pop_comm_buf.m_pushed_slots.push_back( entry );
}